

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::Image::ImageFormatCase::iterate(ImageFormatCase *this)

{
  pointer pOVar1;
  Action *pAVar2;
  int iVar3;
  
  iVar3 = this->m_curIter;
  this->m_curIter = iVar3 + 1;
  pOVar1 = (this->m_spec).operations.
           super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = pOVar1[iVar3].action;
  iVar3 = (*pAVar2->_vptr_Action[2])
                    (pAVar2,(this->m_apiContexts).
                            super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[pOVar1[iVar3].apiIndex],
                     &this->m_img,&this->m_refImg);
  if ((char)iVar3 != '\0') {
    if (this->m_curIter <
        (int)((ulong)((long)(this->m_spec).operations.
                            super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_spec).operations.
                           super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      return CONTINUE;
    }
    if ((char)iVar3 != '\0') {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  return STOP;
}

Assistant:

TestCase::IterateResult ImageFormatCase::iterate (void)
{
	const TestSpec::Operation&	op		= m_spec.operations[m_curIter++];
	ImageApi&					api		= *m_apiContexts[op.apiIndex];
	const bool					isOk	= op.action->invoke(api, m_img, m_refImg);

	if (isOk && m_curIter < (int)m_spec.operations.size())
		return CONTINUE;
	else if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}